

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_add_integer_into_shifted_by_words(mp_int *r,mp_int *a,uintmax_t n,size_t word_index)

{
  size_t sVar1;
  ulong uVar2;
  BignumInt *pBVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  sVar1 = r->nw;
  if (sVar1 != 0) {
    uVar2 = a->nw;
    pBVar3 = r->w;
    uVar5 = 0;
    uVar9 = 0;
    uVar6 = 0;
    do {
      if (uVar6 < uVar2) {
        uVar4 = a->w[uVar6];
      }
      else {
        uVar4 = 0;
      }
      uVar5 = (ulong)((uint)uVar5 |
                     (uint)(((uVar6 ^ word_index) & 1) == 0 && (uVar6 ^ word_index) >> 1 == 0));
      uVar7 = -uVar5 & n;
      n = n & uVar5 - 1;
      uVar8 = uVar7 + uVar9;
      uVar9 = (ulong)CARRY8(uVar7,uVar9) + (ulong)CARRY8(uVar8,uVar4);
      pBVar3[uVar6] = uVar8 + uVar4;
      uVar6 = uVar6 + 1;
    } while (sVar1 != uVar6);
  }
  return;
}

Assistant:

static void mp_add_integer_into_shifted_by_words(
    mp_int *r, mp_int *a, uintmax_t n, size_t word_index)
{
    unsigned indicator = 0;
    BignumCarry carry = 0;

    for (size_t i = 0; i < r->nw; i++) {
        /* indicator becomes 1 when we reach the index that the least
         * significant bits of n want to be placed at, and it stays 1
         * thereafter. */
        indicator |= 1 ^ normalise_to_1(i ^ word_index);

        /* If indicator is 1, we add the low bits of n into r, and
         * shift n down. If it's 0, we add zero bits into r, and
         * leave n alone. */
        BignumInt bword = n & -(BignumInt)indicator;
        uintmax_t new_n = shift_right_by_one_word(n);
        n ^= (n ^ new_n) & -(uintmax_t)indicator;

        BignumInt aword = mp_word(a, i);
        BignumInt out;
        BignumADC(out, carry, aword, bword, carry);
        r->w[i] = out;
    }
}